

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePathCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_3f1d1e::HandleRemoveExtensionCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  _List *path_00;
  cmExecutionStatus *this;
  bool bVar1;
  int iVar2;
  ArgumentParserWithOutputVariable<Arguments> *pAVar3;
  cmMakefile *pcVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  const_reference arg;
  static_string_view name;
  string *local_250;
  string local_1f0;
  string_view local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  undefined1 local_1a0 [8];
  cmCMakePath path;
  string inputPath;
  string local_150;
  undefined4 local_12c;
  undefined1 local_128 [8];
  Arguments arguments;
  ArgumentParserWithOutputVariable<Arguments> local_a8;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  if ((anonymous_namespace)::
      HandleRemoveExtensionCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
      ::parser == '\0') {
    iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 HandleRemoveExtensionCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                 ::parser);
    if (iVar2 != 0) {
      ArgumentParserWithOutputVariable<Arguments>::ArgumentParserWithOutputVariable(&local_a8);
      name = ::cm::operator____s("LAST_ONLY",9);
      arguments._88_8_ = name.super_string_view._M_len;
      pAVar3 = ArgumentParserWithOutputVariable<Arguments>::Bind<bool>(&local_a8,name,0x58);
      ArgumentParserWithOutputVariable<Arguments>::ArgumentParserWithOutputVariable
                (&HandleRemoveExtensionCommand::parser,pAVar3);
      ArgumentParserWithOutputVariable<Arguments>::~ArgumentParserWithOutputVariable(&local_a8);
      __cxa_atexit(ArgumentParserWithOutputVariable<Arguments>::~ArgumentParserWithOutputVariable,
                   &HandleRemoveExtensionCommand::parser,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::
                           HandleRemoveExtensionCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                           ::parser);
    }
  }
  ArgumentParserWithOutputVariable<Arguments>::Parse<2>
            ((Arguments *)local_128,&HandleRemoveExtensionCommand::parser,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)status_local);
  pcVar4 = cmExecutionStatus::GetMakefile(local_20);
  bVar1 = ArgumentParser::ParseResult::MaybeReportError((ParseResult *)local_128,pcVar4);
  if (bVar1) {
    args_local._7_1_ = 1;
    local_12c = 1;
  }
  else {
    this_00 = (anonymous_namespace)::
              CMakePathArgumentParser<(anonymous_namespace)::HandleRemoveExtensionCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              ::GetInputs_abi_cxx11_
                        ((CMakePathArgumentParser<(anonymous_namespace)::HandleRemoveExtensionCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                          *)&HandleRemoveExtensionCommand::parser);
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(this_00);
    this = local_20;
    if (bVar1) {
      path_00 = &path.Path._M_cmpts;
      std::__cxx11::string::string((string *)path_00);
      arg = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)status_local,1);
      bVar1 = getInputPath(arg,local_20,(string *)path_00);
      if (bVar1) {
        std::__cxx11::string::string((string *)&local_1c0,(string *)&path.Path._M_cmpts);
        cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
                  ((cmCMakePath *)local_1a0,&local_1c0,generic_format);
        std::__cxx11::string::~string((string *)&local_1c0);
        if ((arguments.Output.
             super__Optional_base<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_engaged & 1U) == 0) {
          cmCMakePath::RemoveWideExtension((cmCMakePath *)local_1a0);
        }
        else {
          cmCMakePath::RemoveExtension((cmCMakePath *)local_1a0);
        }
        pcVar4 = cmExecutionStatus::GetMakefile(local_20);
        bVar1 = std::optional::operator_cast_to_bool
                          ((optional *)
                           &arguments.super_ParseResult.KeywordErrors._M_t._M_impl.
                            super__Rb_tree_header._M_node_count);
        if (bVar1) {
          local_250 = &std::
                       optional<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator*((optional<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&arguments.super_ParseResult.KeywordErrors._M_t._M_impl.
                                       super__Rb_tree_header._M_node_count)->
                       super_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>;
        }
        else {
          local_250 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)status_local,1);
        }
        cmCMakePath::String_abi_cxx11_(&local_1f0,(cmCMakePath *)local_1a0);
        local_1d0 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1f0);
        cmMakefile::AddDefinition(pcVar4,local_250,local_1d0);
        std::__cxx11::string::~string((string *)&local_1f0);
        args_local._7_1_ = 1;
        local_12c = 1;
        cmCMakePath::~cmCMakePath((cmCMakePath *)local_1a0);
      }
      else {
        args_local._7_1_ = 0;
        local_12c = 1;
      }
      std::__cxx11::string::~string((string *)&path.Path._M_cmpts);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_150,"REMOVE_EXTENSION called with unexpected arguments.",
                 (allocator<char> *)(inputPath.field_2._M_local_buf + 0xf));
      cmExecutionStatus::SetError(this,&local_150);
      std::__cxx11::string::~string((string *)&local_150);
      std::allocator<char>::~allocator((allocator<char> *)(inputPath.field_2._M_local_buf + 0xf));
      args_local._7_1_ = 0;
      local_12c = 1;
    }
  }
  HandleRemoveExtensionCommand::Arguments::~Arguments((Arguments *)local_128);
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool HandleRemoveExtensionCommand(std::vector<std::string> const& args,
                                  cmExecutionStatus& status)
{
  struct Arguments : public ArgumentParser::ParseResult
  {
    cm::optional<ArgumentParser::NonEmpty<std::string>> Output;
    bool LastOnly = false;
  };

  static auto const parser =
    ArgumentParserWithOutputVariable<Arguments>{}.Bind("LAST_ONLY"_s,
                                                       &Arguments::LastOnly);

  Arguments const arguments = parser.Parse(args);

  if (arguments.MaybeReportError(status.GetMakefile())) {
    return true;
  }

  if (!parser.GetInputs().empty()) {
    status.SetError("REMOVE_EXTENSION called with unexpected arguments.");
    return false;
  }

  std::string inputPath;
  if (!getInputPath(args[1], status, inputPath)) {
    return false;
  }

  cmCMakePath path(inputPath);

  if (arguments.LastOnly) {
    path.RemoveExtension();
  } else {
    path.RemoveWideExtension();
  }

  status.GetMakefile().AddDefinition(
    arguments.Output ? *arguments.Output : args[1], path.String());

  return true;
}